

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O0

Fraig_Node_t * Fraig_NodeCreateConst(Fraig_Man_t *p)

{
  Fraig_Node_t *Entry;
  uint *puVar1;
  Fraig_Node_t *pNode;
  Fraig_Man_t *p_local;
  
  Entry = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmNodes);
  memset(Entry,0,0xa0);
  Entry->Num = p->vNodes->nSize;
  Fraig_NodeVecPush(p->vNodes,Entry);
  Entry->NumPi = -1;
  Entry->Level = 0;
  Entry->nRefs = 1;
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfffffffe | 1;
  puVar1 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  Entry->puSimR = puVar1;
  Entry->puSimD = Entry->puSimR + p->nWordsRand;
  memset(Entry->puSimR,0,(long)p->nWordsRand << 2);
  memset(Entry->puSimD,0,(long)p->nWordsDyna << 2);
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfff | p->nWordsRand << 0x11;
  Fraig_HashTableLookupF0(p,Entry);
  return Entry;
}

Assistant:

Fraig_Node_t * Fraig_NodeCreateConst( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;

    // create the node
    pNode = (Fraig_Node_t *)Fraig_MemFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Fraig_Node_t) );

    // assign the number and add to the array of nodes
    pNode->Num   = p->vNodes->nSize;
    Fraig_NodeVecPush( p->vNodes,  pNode );
    pNode->NumPi = -1;  // this is not a PI, so its number is -1
    pNode->Level =  0;  // just like a PI, it has 0 level
    pNode->nRefs =  1;  // it is a persistent node, which comes referenced
    pNode->fInv  =  1;  // the simulation info is complemented

    // create the simulation info
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    memset( pNode->puSimR, 0, sizeof(unsigned) * p->nWordsRand );
    memset( pNode->puSimD, 0, sizeof(unsigned) * p->nWordsDyna );

    // count the number of ones in the simulation vector
    pNode->nOnes = p->nWordsRand * sizeof(unsigned) * 8;

    // insert it into the hash table
    Fraig_HashTableLookupF0( p, pNode );
    return pNode;
}